

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O0

void __thiscall SQCompilation::RenderVisitor::visitClassDecl(RenderVisitor *this,ClassDecl *cls)

{
  TreeOp TVar1;
  Expr *pEVar2;
  Node *this_00;
  ClassDecl *in_RSI;
  OutputStream *in_RDI;
  byte bVar3;
  bool addParens;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  OutputStream::writeString
            (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  pEVar2 = ClassDecl::classKey(in_RSI);
  if (pEVar2 != (Expr *)0x0) {
    ClassDecl::classKey(in_RSI);
    Node::visit<SQCompilation::RenderVisitor>
              ((Node *)in_RSI,
               (RenderVisitor *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  }
  pEVar2 = ClassDecl::classBase(in_RSI);
  if (pEVar2 != (Expr *)0x0) {
    OutputStream::writeString
              (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    this_00 = &ClassDecl::classBase(in_RSI)->super_Node;
    TVar1 = Node::op(this_00);
    bVar3 = TVar1 == TO_DECL_EXPR;
    if ((bool)bVar3) {
      OutputStream::writeChar(in_RDI,in_stack_ffffffffffffffdf);
    }
    ClassDecl::classBase(in_RSI);
    Node::visit<SQCompilation::RenderVisitor>
              ((Node *)in_RSI,(RenderVisitor *)CONCAT17(bVar3,in_stack_ffffffffffffffe8));
    if ((bVar3 & 1) != 0) {
      OutputStream::writeChar(in_RDI,in_stack_ffffffffffffffdf);
    }
    OutputStream::writeChar(in_RDI,in_stack_ffffffffffffffdf);
  }
  (*in_RDI->_vptr_OutputStream[0x2d])(in_RDI,in_RSI);
  return;
}

Assistant:

virtual void visitClassDecl(ClassDecl *cls) {
        _out->writeString("CLASS ");
        if (cls->classKey()) cls->classKey()->visit(this);
        if (cls->classBase()) {
            _out->writeString("EXTENDS ");
            bool addParens = cls->classBase()->op() == TO_DECL_EXPR;
            if (addParens)
              _out->writeChar('(');
            cls->classBase()->visit(this);
            if (addParens)
              _out->writeChar(')');
            _out->writeChar(' ');
        }
        visitTableDecl(cls);
    }